

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_gotobasedialog.h
# Opt level: O2

void __thiscall Ui_GoToBaseDialog::retranslateUi(Ui_GoToBaseDialog *this,QDialog *GoToBaseDialog)

{
  QLabel *pQVar1;
  QArrayDataPointer<char16_t> local_38;
  
  QCoreApplication::translate((char *)&local_38,"GoToBaseDialog","Select item at base",0);
  QWidget::setWindowTitle((QString *)GoToBaseDialog);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QGroupBox::setTitle((QString *)this->groupBox);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  pQVar1 = this->label;
  QCoreApplication::translate((char *)&local_38,"GoToBaseDialog","Select item at base:",0);
  QLabel::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  return;
}

Assistant:

void retranslateUi(QDialog *GoToBaseDialog)
    {
        GoToBaseDialog->setWindowTitle(QCoreApplication::translate("GoToBaseDialog", "Select item at base", nullptr));
        groupBox->setTitle(QString());
        label->setText(QCoreApplication::translate("GoToBaseDialog", "Select item at base:", nullptr));
    }